

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::doPendingFuntors(EventLoop *this)

{
  bool bVar1;
  reference this_00;
  Functor *functor;
  iterator __end1;
  iterator __begin1;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range1;
  MutexLockGuard local_30;
  MutexLockGuard lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  EventLoop *this_local;
  
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock);
  this->callingPendingFunctors_ = true;
  MutexLockGuard::MutexLockGuard(&local_30,&this->mutex_);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::swap
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock,
             &this->pendingFuntors_);
  MutexLockGuard::~MutexLockGuard(&local_30);
  __end1 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                     ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                      &lock);
  functor = (Functor *)
            std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                      ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                       &lock);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                                *)&functor);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
              ::operator*(&__end1);
    std::function<void_()>::operator()(this_00);
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator++(&__end1);
  }
  this->callingPendingFunctors_ = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock);
  return;
}

Assistant:

void EventLoop::doPendingFuntors() {
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;
    
    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFuntors_);
    }

    for(const Functor& functor : functors) {
        functor();
    }

    callingPendingFunctors_ = false;
}